

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspConfig::reset(ClaspConfig *this)

{
  SumVec *pSVar1;
  undefined1 auVar2 [16];
  ScheduleStrategy SVar3;
  long *plVar4;
  Memcpy<long> local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  ScheduleStrategy local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  if (this->tester_ != (UserConfig *)0x0) {
    (*(this->tester_->super_UserConfiguration).super_Configuration._vptr_Configuration[0xd])();
  }
  Impl::reset(this->impl_);
  BasicSatConfig::reset(&this->super_BasicSatConfig);
  local_28 = (undefined1  [16])0x0;
  local_38 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68._0_4_ = 0;
  local_68.idx = 0;
  local_68.len = 0;
  local_68.grow = 0.0;
  local_88 = 0xffffffff;
  uStack_84 = 0xffffffff;
  uStack_80 = 0xffffffff;
  uStack_7c = 0xffffffff;
  local_78._0_12_ = ZEXT812(0x10000400);
  local_78._12_4_ = 0;
  ScheduleStrategy::ScheduleStrategy(&local_68,Geometric,100,1.5,0);
  SVar3 = local_68;
  auVar2 = local_78;
  local_58._8_8_ = 0xffffffffffffffff;
  local_58._0_8_ = 0x100000001;
  local_48 = ZEXT816(0x100000000);
  local_38 = ZEXT816(0);
  local_28 = ZEXT816(0);
  (this->solve).super_ParallelSolveOptions.algorithm.threads = 1;
  (this->solve).super_ParallelSolveOptions.algorithm.mode = mode_compete;
  *(undefined4 *)&(this->solve).super_ParallelSolveOptions.restarts.sched.field_0x0 = local_68._0_4_
  ;
  (this->solve).super_ParallelSolveOptions.restarts.sched.idx = local_68.idx;
  (this->solve).super_ParallelSolveOptions.restarts.sched.len = local_68.len;
  (this->solve).super_ParallelSolveOptions.restarts.sched.grow = local_68.grow;
  (this->solve).super_ParallelSolveOptions.integrate = (Integration)local_78._0_4_;
  (this->solve).super_ParallelSolveOptions.distribute.super_Policy = (Policy)local_78._4_4_;
  *(undefined8 *)&(this->solve).super_ParallelSolveOptions.distribute.mode = local_78._8_8_;
  (this->solve).super_ParallelSolveOptions.super_BasicSolveOptions.limit.conflicts =
       CONCAT44(uStack_84,local_88);
  (this->solve).super_ParallelSolveOptions.super_BasicSolveOptions.limit.restarts =
       CONCAT44(uStack_7c,uStack_80);
  (this->solve).super_EnumOptions.proMode = Implicit;
  (this->solve).super_EnumOptions.project = 0;
  (this->solve).super_EnumOptions.numModels = -1;
  (this->solve).super_EnumOptions.enumMode = enum_auto;
  (this->solve).super_EnumOptions.optMode = optimize;
  pSVar1 = &(this->solve).super_EnumOptions.optBound;
  plVar4 = (long *)0x0;
  local_78 = auVar2;
  local_68 = SVar3;
  if (pSVar1 != (SumVec *)local_38) {
    (this->solve).super_EnumOptions.optBound.ebo_.size = 0;
    local_90.first_ = (long *)0x0;
    bk_lib::pod_vector<long,std::allocator<long>>::
    insert_impl<unsigned_int,bk_lib::detail::Memcpy<long>>
              ((pod_vector<long,std::allocator<long>> *)pSVar1,
               (this->solve).super_EnumOptions.optBound.ebo_.buf,0,&local_90);
    plVar4 = (long *)local_28._0_8_;
  }
  pSVar1 = &(this->solve).super_EnumOptions.optStop;
  if (pSVar1 != (SumVec *)local_28) {
    (this->solve).super_EnumOptions.optStop.ebo_.size = 0;
    local_90.first_ = plVar4;
    bk_lib::pod_vector<long,std::allocator<long>>::
    insert_impl<unsigned_int,bk_lib::detail::Memcpy<long>>
              ((pod_vector<long,std::allocator<long>> *)pSVar1,
               (this->solve).super_EnumOptions.optStop.ebo_.buf,local_28._8_4_,&local_90);
    plVar4 = (long *)local_28._0_8_;
  }
  if (plVar4 != (long *)0x0) {
    operator_delete(plVar4);
  }
  if ((void *)local_38._0_8_ != (void *)0x0) {
    operator_delete((void *)local_38._0_8_);
  }
  this->asp = (AspOptions)0x500000000;
  return;
}

Assistant:

void ClaspConfig::reset() {
	if (tester_) { tester_->reset(); }
	impl_->reset();
	BasicSatConfig::reset();
	solve = SolveOptions();
	asp   = AspOptions();
}